

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

ostream * CGL::operator<<(ostream *os,Matrix3x3 *A)

{
  ostream *poVar1;
  int i;
  long lVar2;
  long lVar3;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    std::operator<<(os,"[ ");
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)A + lVar3));
      std::operator<<(poVar1," ");
    }
    poVar1 = std::operator<<(os,"]");
    std::endl<char,std::char_traits<char>>(poVar1);
    A = (Matrix3x3 *)((long)A + 8);
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Matrix3x3& A ) {
    for( int i = 0; i < 3; i++ )
    {
       os << "[ ";

       for( int j = 0; j < 3; j++ )
       {
          os << A(i,j) << " ";
       }

       os << "]" << std::endl;
    }

    return os;
  }